

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatVehicle.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatVehicle::operator==
          (GED_EnhancedGroundCombatVehicle *this,GED_EnhancedGroundCombatVehicle *Value)

{
  KBOOL KVar1;
  
  KVar1 = GED_BasicGroundCombatVehicle::operator!=
                    (&this->super_GED_BasicGroundCombatVehicle,
                     &Value->super_GED_BasicGroundCombatVehicle);
  if ((((KVar1) || (this->m_ui8FuelStatus != Value->m_ui8FuelStatus)) ||
      (this->m_ui8GrndMaintStatus != Value->m_ui8GrndMaintStatus)) ||
     (this->m_ui8PriAmmun != Value->m_ui8PriAmmun)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui8SecAmmun == Value->m_ui8SecAmmun;
  }
  return KVar1;
}

Assistant:

KBOOL GED_EnhancedGroundCombatVehicle::operator == ( const GED_EnhancedGroundCombatVehicle & Value ) const
{
    if( GED_BasicGroundCombatVehicle::operator!=( Value ) )     return false;
    if( m_ui8FuelStatus         != Value.m_ui8FuelStatus )      return false;
    if( m_ui8GrndMaintStatus    != Value.m_ui8GrndMaintStatus ) return false;
    if( m_ui8PriAmmun           != Value.m_ui8PriAmmun )        return false;
    if( m_ui8SecAmmun           != Value.m_ui8SecAmmun )        return false;
    return true;
}